

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

RepeatedField<float> * __thiscall
google::protobuf::RepeatedField<float>::operator=
          (RepeatedField<float> *this,RepeatedField<float> *other)

{
  if (this != other) {
    this->current_size_ = 0;
    if (other->current_size_ != 0) {
      Reserve(this,other->current_size_);
      this->current_size_ = this->current_size_ + other->current_size_;
      memcpy(this->arena_or_elements_,other->arena_or_elements_,(long)other->current_size_ << 2);
    }
  }
  return this;
}

Assistant:

inline RepeatedField<Element>& RepeatedField<Element>::operator=(
    const RepeatedField& other) {
  if (this != &other) CopyFrom(other);
  return *this;
}